

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

bool __thiscall Container::is_memory_limit_hit(Container *this)

{
  CgroupController *pCVar1;
  longlong lVar2;
  size_t in_RCX;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  string data;
  Container *this_local;
  
  pCVar1 = this->memory_controller_;
  data.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"memory.failcnt",&local_51);
  CgroupController::read((CgroupController *)local_30,(int)pCVar1,local_50,in_RCX);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  lVar2 = std::__cxx11::stoll((string *)local_30,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)local_30);
  return lVar2 != 0;
}

Assistant:

bool Container::is_memory_limit_hit() {
    std::string data = memory_controller_->read("memory.failcnt");
    return stoll(data);
}